

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpreadwrite.c
# Opt level: O2

int MakeGetMessageEx(char *url_str,membuffer *request,uri_type *url,SendInstruction *pRangeSpecifier
                    )

{
  size_t sVar1;
  int iVar2;
  int iVar3;
  size_t urlstrlen;
  size_t hostlen;
  char *hoststr;
  
  hostlen = 0;
  urlstrlen = strlen(url_str);
  UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/http/httpreadwrite.c",0x817,"DOWNLOAD URL : %s\n",
             url_str);
  iVar2 = http_FixStrUrl(url_str,urlstrlen,url);
  if (iVar2 == 0) {
    membuffer_init(request);
    iVar2 = get_hoststr(url_str,&hoststr,&hostlen);
    sVar1 = hostlen;
    if (iVar2 == 0) {
      iVar2 = 0;
      UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/http/httpreadwrite.c",0x827,
                 "HOSTNAME : %s Length : %zu\n",hoststr,hostlen);
      iVar3 = http_MakeMessage(request,1,1,"QsbcGDCUc",2,(url->pathquery).buff,(url->pathquery).size
                               ,"HOST: ",hoststr,sVar1,pRangeSpecifier);
      if (iVar3 != 0) {
        UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/http/httpreadwrite.c",0x83d,
                   "HTTP Makemessage failed\n");
        membuffer_destroy(request);
        return iVar3;
      }
    }
  }
  UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/http/httpreadwrite.c",0x846,
             "HTTP Buffer:\n%s\n----------END--------\n",request->buf);
  return iVar2;
}

Assistant:

int MakeGetMessageEx(const char *url_str,
	membuffer *request,
	uri_type *url,
	struct SendInstruction *pRangeSpecifier)
{
	size_t url_str_len;
	int ret_code = UPNP_E_SUCCESS;
	size_t hostlen = 0;
	const char *hoststr;

	url_str_len = strlen(url_str);
	do {
		UpnpPrintf(UPNP_INFO,
			HTTP,
			__FILE__,
			__LINE__,
			"DOWNLOAD URL : %s\n",
			url_str);
		ret_code = http_FixStrUrl(url_str, url_str_len, url);
		if (ret_code != UPNP_E_SUCCESS) {
			break;
		}
		/* make msg */
		membuffer_init(request);
		ret_code = get_hoststr(url_str, &hoststr, &hostlen);
		if (ret_code != UPNP_E_SUCCESS) {
			break;
		}
		UpnpPrintf(UPNP_INFO,
			HTTP,
			__FILE__,
			__LINE__,
			"HOSTNAME : %s Length : %" PRIzu "\n",
			hoststr,
			hostlen);
		ret_code = http_MakeMessage(request,
			1,
			1,
			"Q"
			"s"
			"bc"
			"GDCUc",
			HTTPMETHOD_GET,
			url->pathquery.buff,
			url->pathquery.size,
			"HOST: ",
			hoststr,
			hostlen,
			pRangeSpecifier);
		if (ret_code != 0) {
			UpnpPrintf(UPNP_INFO,
				HTTP,
				__FILE__,
				__LINE__,
				"HTTP Makemessage failed\n");
			membuffer_destroy(request);
			return ret_code;
		}
	} while (0);
	UpnpPrintf(UPNP_INFO,
		HTTP,
		__FILE__,
		__LINE__,
		"HTTP Buffer:\n%s\n"
		"----------END--------\n",
		request->buf);

	return ret_code;
}